

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_extension
              (nghttp2_session *session,uint8_t type,uint8_t flags,int32_t stream_id,void *payload)

{
  nghttp2_outbound_item *item_00;
  nghttp2_mem *mem;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  int rv;
  void *payload_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  uint8_t type_local;
  nghttp2_session *session_local;
  
  if (type < 10) {
    session_local._4_4_ = -0x1f5;
  }
  else if ((session->callbacks).pack_extension_callback == (nghttp2_pack_extension_callback)0x0) {
    session_local._4_4_ = -0x207;
  }
  else {
    item_00 = (nghttp2_outbound_item *)nghttp2_mem_malloc(&session->mem,0x98);
    if (item_00 == (nghttp2_outbound_item *)0x0) {
      session_local._4_4_ = -0x385;
    }
    else {
      nghttp2_outbound_item_init(item_00);
      nghttp2_frame_extension_init((nghttp2_extension *)item_00,type,flags,stream_id,payload);
      session_local._4_4_ = nghttp2_session_add_item(session,item_00);
      if (session_local._4_4_ == 0) {
        session_local._4_4_ = 0;
      }
      else {
        nghttp2_frame_extension_free((nghttp2_extension *)item_00);
        nghttp2_mem_free(&session->mem,item_00);
      }
    }
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_submit_extension(nghttp2_session *session, uint8_t type,
                             uint8_t flags, int32_t stream_id, void *payload) {
  int rv;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_mem *mem;

  mem = &session->mem;

  if (type <= NGHTTP2_CONTINUATION) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!session->callbacks.pack_extension_callback) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;
  nghttp2_frame_extension_init(&frame->ext, type, flags, stream_id, payload);

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_extension_free(&frame->ext);
    nghttp2_mem_free(mem, item);
    return rv;
  }

  return 0;
}